

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::Draw::Implementation::Implementation
          (Implementation *this,OperationContext *context,Resource *resource,DrawCall drawCall)

{
  VkImageSubresourceRange *pVVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  VkPipelineLayout pipelineLayout;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data_00;
  VkImageSubresourceRange subresourceRange;
  RefData<vk::Handle<(vk::HandleType)13>_> data_01;
  RefData<vk::Handle<(vk::HandleType)17>_> data_02;
  RefData<vk::Handle<(vk::HandleType)23>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Allocator *pAVar7;
  Allocator *pAVar8;
  VkDevice pVVar9;
  deUint32 dVar10;
  VkFormat VVar11;
  Buffer *pBVar12;
  VkDeviceSize VVar13;
  ImageResource *pIVar14;
  Handle<(vk::HandleType)17> *pHVar15;
  Handle<(vk::HandleType)13> *pHVar16;
  GraphicsPipelineBuilder *pGVar17;
  ProgramCollection<vk::ProgramBinary> *pPVar18;
  ProgramBinary *pPVar19;
  Handle<(vk::HandleType)16> *pHVar20;
  PipelineCacheData *pipelineCacheData;
  reference data_06;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  VkClearValue local_468;
  TextureFormat local_458;
  undefined1 local_450 [8];
  PixelBufferAccess imagePixels;
  Move<vk::Handle<(vk::HandleType)18>_> local_418;
  RefData<vk::Handle<(vk::HandleType)18>_> local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  Vector<int,_2> local_388;
  undefined1 local_380 [8];
  GraphicsPipelineBuilder pipelineBuilder;
  RefData<vk::Handle<(vk::HandleType)16>_> local_258;
  deUint64 local_238;
  VkRenderPass local_230;
  Move<vk::Handle<(vk::HandleType)23>_> local_228;
  RefData<vk::Handle<(vk::HandleType)23>_> local_208;
  Move<vk::Handle<(vk::HandleType)17>_> local_1e8;
  RefData<vk::Handle<(vk::HandleType)17>_> local_1c8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  deUint32 local_198;
  deUint64 local_188;
  Move<vk::Handle<(vk::HandleType)13>_> local_180;
  RefData<vk::Handle<(vk::HandleType)13>_> local_160;
  VkDeviceMemory local_140;
  deUint32 *local_138;
  VkDrawIndexedIndirectCommand *pIndirectCommand_1;
  Allocation *alloc_1;
  VkBufferCreateInfo local_120;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> local_e8;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *local_d8
  ;
  VkDeviceMemory local_c8;
  deUint32 *local_c0;
  VkDrawIndirectCommand *pIndirectCommand;
  Allocation *alloc;
  VkBufferCreateInfo local_a8;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> local_70;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> *local_60
  ;
  Allocator *local_50;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  DrawCall local_24;
  Resource *pRStack_20;
  DrawCall drawCall_local;
  Resource *resource_local;
  OperationContext *context_local;
  Implementation *this_local;
  
  local_24 = drawCall;
  pRStack_20 = resource;
  resource_local = (Resource *)context;
  context_local = (OperationContext *)this;
  Operation::Operation(&this->super_Operation);
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__Implementation_016b3758;
  this->m_context = (OperationContext *)resource_local;
  this->m_resource = pRStack_20;
  this->m_drawCall = local_24;
  VertexGrid::VertexGrid(&this->m_vertices,(OperationContext *)resource_local);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_expectedData);
  de::details::
  MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::MovePtr
            (&this->m_indirectBuffer);
  ::vk::Handle<(vk::HandleType)9>::Handle(&this->m_colorImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_colorAttachmentView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  device = (VkDevice)OperationContext::getDeviceInterface((OperationContext *)resource_local);
  allocator = (Allocator *)OperationContext::getDevice((OperationContext *)resource_local);
  local_50 = OperationContext::getAllocator((OperationContext *)resource_local);
  if (this->m_drawCall == DRAW_CALL_DRAW_INDIRECT) {
    pBVar12 = (Buffer *)operator_new(0x30);
    pVVar9 = device;
    pAVar8 = allocator;
    pAVar7 = local_50;
    makeBufferCreateInfo(&local_a8,0x10,0x100);
    alloc._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
    synchronization::Buffer::Buffer
              (pBVar12,(DeviceInterface *)pVVar9,(VkDevice)pAVar8,pAVar7,&local_a8,
               ::vk::MemoryRequirement::HostVisible);
    de::DefaultDeleter<vkt::synchronization::Buffer>::DefaultDeleter
              ((DefaultDeleter<vkt::synchronization::Buffer> *)((long)&alloc + 3));
    de::details::
    MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    MovePtr((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             *)&local_70);
    local_60 = de::details::MovePtr::operator_cast_to_PtrData(&local_70,(MovePtr *)pBVar12);
    data.ptr._4_4_ = in_stack_fffffffffffff9dc;
    data.ptr._0_4_ = in_stack_fffffffffffff9d8;
    data._8_4_ = in_stack_fffffffffffff9e0;
    data._12_4_ = in_stack_fffffffffffff9e4;
    de::details::
    MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    operator=(&this->m_indirectBuffer,data);
    de::details::
    MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    ~MovePtr((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_70);
    pBVar12 = de::details::
              UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              ::operator->(&(this->m_indirectBuffer).
                            super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                          );
    pIndirectCommand = (VkDrawIndirectCommand *)synchronization::Buffer::getAllocation(pBVar12);
    local_c0 = (deUint32 *)::vk::Allocation::getHostPtr((Allocation *)pIndirectCommand);
    dVar10 = VertexGrid::getNumVertices(&this->m_vertices);
    pVVar9 = device;
    pAVar7 = allocator;
    *local_c0 = dVar10;
    local_c0[1] = 1;
    local_c0[2] = 0;
    local_c0[3] = 0;
    local_c8 = ::vk::Allocation::getMemory((Allocation *)pIndirectCommand);
    VVar13 = ::vk::Allocation::getOffset((Allocation *)pIndirectCommand);
    ::vk::flushMappedMemoryRange((DeviceInterface *)pVVar9,(VkDevice)pAVar7,local_c8,VVar13,0x10);
  }
  else if (this->m_drawCall == DRAW_CALL_DRAW_INDEXED_INDIRECT) {
    pBVar12 = (Buffer *)operator_new(0x30);
    pVVar9 = device;
    pAVar8 = allocator;
    pAVar7 = local_50;
    makeBufferCreateInfo(&local_120,0x14,0x100);
    alloc_1._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
    synchronization::Buffer::Buffer
              (pBVar12,(DeviceInterface *)pVVar9,(VkDevice)pAVar8,pAVar7,&local_120,
               ::vk::MemoryRequirement::HostVisible);
    de::DefaultDeleter<vkt::synchronization::Buffer>::DefaultDeleter
              ((DefaultDeleter<vkt::synchronization::Buffer> *)((long)&alloc_1 + 3));
    de::details::
    MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    MovePtr((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             *)&local_e8);
    local_d8 = de::details::MovePtr::operator_cast_to_PtrData(&local_e8,(MovePtr *)pBVar12);
    data_00.ptr._4_4_ = in_stack_fffffffffffff9dc;
    data_00.ptr._0_4_ = in_stack_fffffffffffff9d8;
    data_00._8_4_ = in_stack_fffffffffffff9e0;
    data_00._12_4_ = in_stack_fffffffffffff9e4;
    de::details::
    MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    operator=(&this->m_indirectBuffer,data_00);
    de::details::
    MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    ~MovePtr((MovePtr<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              *)&local_e8);
    pBVar12 = de::details::
              UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
              ::operator->(&(this->m_indirectBuffer).
                            super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
                          );
    pIndirectCommand_1 =
         (VkDrawIndexedIndirectCommand *)synchronization::Buffer::getAllocation(pBVar12);
    local_138 = (deUint32 *)::vk::Allocation::getHostPtr((Allocation *)pIndirectCommand_1);
    dVar10 = VertexGrid::getNumIndices(&this->m_vertices);
    pVVar9 = device;
    pAVar7 = allocator;
    *local_138 = dVar10;
    local_138[1] = 1;
    local_138[2] = 0;
    local_138[3] = 0;
    local_138[4] = 0;
    local_140 = ::vk::Allocation::getMemory((Allocation *)pIndirectCommand_1);
    VVar13 = ::vk::Allocation::getOffset((Allocation *)pIndirectCommand_1);
    ::vk::flushMappedMemoryRange((DeviceInterface *)pVVar9,(VkDevice)pAVar7,local_140,VVar13,0x14);
  }
  pIVar14 = Resource::getImage(this->m_resource);
  this->m_colorFormat = pIVar14->format;
  pIVar14 = Resource::getImage(this->m_resource);
  (this->m_colorSubresourceRange).layerCount = (pIVar14->subresourceRange).layerCount;
  dVar10 = (pIVar14->subresourceRange).baseMipLevel;
  dVar2 = (pIVar14->subresourceRange).levelCount;
  dVar3 = (pIVar14->subresourceRange).baseArrayLayer;
  (this->m_colorSubresourceRange).aspectMask = (pIVar14->subresourceRange).aspectMask;
  (this->m_colorSubresourceRange).baseMipLevel = dVar10;
  (this->m_colorSubresourceRange).levelCount = dVar2;
  (this->m_colorSubresourceRange).baseArrayLayer = dVar3;
  pIVar14 = Resource::getImage(this->m_resource);
  (this->m_colorImage).m_internal = (pIVar14->handle).m_internal;
  pIVar14 = Resource::getImage(this->m_resource);
  (this->m_attachmentExtent).depth = (pIVar14->extent).depth;
  dVar10 = (pIVar14->extent).height;
  (this->m_attachmentExtent).width = (pIVar14->extent).width;
  (this->m_attachmentExtent).height = dVar10;
  local_188 = (this->m_colorImage).m_internal;
  local_198 = (this->m_colorSubresourceRange).layerCount;
  pVVar1 = &this->m_colorSubresourceRange;
  local_1a8._0_4_ = pVVar1->aspectMask;
  local_1a8._4_4_ = pVVar1->baseMipLevel;
  uStack_1a0._0_4_ = (this->m_colorSubresourceRange).levelCount;
  uStack_1a0._4_4_ = (this->m_colorSubresourceRange).baseArrayLayer;
  uVar4 = pVVar1->aspectMask;
  uVar5 = pVVar1->baseMipLevel;
  uVar6 = pVVar1->levelCount;
  subresourceRange.levelCount = uVar6;
  subresourceRange.baseMipLevel = uVar5;
  subresourceRange.aspectMask = uVar4;
  subresourceRange.baseArrayLayer = uStack_1a0._4_4_;
  subresourceRange.layerCount = local_198;
  makeImageView(&local_180,(DeviceInterface *)device,(VkDevice)allocator,(VkImage)local_188,
                VK_IMAGE_VIEW_TYPE_2D,this->m_colorFormat,subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_160,(Move *)&local_180);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_160.deleter.m_deviceIface;
  data_01.object.m_internal = local_160.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_160.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_160.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_160.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator = local_160.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_colorAttachmentView,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_180);
  makeRenderPass(&local_1e8,(DeviceInterface *)device,(VkDevice)allocator,this->m_colorFormat);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1c8,(Move *)&local_1e8);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_1c8.deleter.m_deviceIface;
  data_02.object.m_internal = local_1c8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1c8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_1c8.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_1c8.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator = local_1c8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_1e8);
  pVVar9 = device;
  pAVar7 = allocator;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  local_230.m_internal = pHVar15->m_internal;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>
                      );
  local_238 = pHVar16->m_internal;
  makeFramebuffer(&local_228,(DeviceInterface *)pVVar9,(VkDevice)pAVar7,local_230,
                  (VkImageView)local_238,(this->m_attachmentExtent).width,
                  (this->m_attachmentExtent).height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_208,(Move *)&local_228);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_208.deleter.m_deviceIface;
  data_03.object.m_internal = local_208.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_208.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_208.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_208.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator = local_208.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(&this->m_framebuffer,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_228);
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&pipelineBuilder.m_blendEnable,
             (DeviceInterface *)device,(VkDevice)allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_258,(Move *)&pipelineBuilder.m_blendEnable);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_258.deleter.m_deviceIface;
  data_04.object.m_internal = local_258.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_258.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_258.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_258.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator = local_258.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
            (&this->m_pipelineLayout,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&pipelineBuilder.m_blendEnable);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_380);
  tcu::Vector<int,_2>::Vector
            (&local_388,(this->m_attachmentExtent).width,(this->m_attachmentExtent).height);
  pGVar17 = GraphicsPipelineBuilder::setRenderSize((GraphicsPipelineBuilder *)local_380,&local_388);
  VVar11 = VertexGrid::getVertexFormat(&this->m_vertices);
  dVar10 = VertexGrid::getVertexStride(&this->m_vertices);
  pGVar17 = GraphicsPipelineBuilder::setVertexInputSingleAttribute(pGVar17,VVar11,dVar10);
  pVVar9 = device;
  pAVar7 = allocator;
  pPVar18 = OperationContext::getBinaryCollection((OperationContext *)resource_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"draw_vert",&local_3a9);
  pPVar19 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar18,&local_3a8);
  pGVar17 = GraphicsPipelineBuilder::setShader
                      (pGVar17,(DeviceInterface *)pVVar9,(VkDevice)pAVar7,VK_SHADER_STAGE_VERTEX_BIT
                       ,pPVar19,(VkSpecializationInfo *)0x0);
  pVVar9 = device;
  pAVar7 = allocator;
  pPVar18 = OperationContext::getBinaryCollection((OperationContext *)resource_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"draw_frag",&local_3d1);
  pPVar19 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar18,&local_3d0);
  GraphicsPipelineBuilder::setShader
            (pGVar17,(DeviceInterface *)pVVar9,(VkDevice)pAVar7,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar19
             ,(VkSpecializationInfo *)0x0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  pVVar9 = device;
  pAVar7 = allocator;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  pipelineLayout.m_internal = pHVar20->m_internal;
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  imagePixels.super_ConstPixelBufferAccess.m_data = (void *)pHVar15->m_internal;
  pipelineCacheData = OperationContext::getPipelineCacheData((OperationContext *)resource_local);
  GraphicsPipelineBuilder::build
            (&local_418,(GraphicsPipelineBuilder *)local_380,(DeviceInterface *)pVVar9,
             (VkDevice)pAVar7,pipelineLayout,
             (VkRenderPass)imagePixels.super_ConstPixelBufferAccess.m_data,pipelineCacheData);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3f8,(Move *)&local_418);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_3f8.deleter.m_deviceIface;
  data_05.object.m_internal = local_3f8.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3f8.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_3f8.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_3f8.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator = local_3f8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(&this->m_pipeline,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_418);
  pIVar14 = Resource::getImage(this->m_resource);
  VVar11 = pIVar14->format;
  pIVar14 = Resource::getImage(this->m_resource);
  VVar13 = getPixelBufferSize(VVar11,&pIVar14->extent);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_expectedData,VVar13);
  local_458 = ::vk::mapVkFormat(this->m_colorFormat);
  dVar10 = (this->m_attachmentExtent).width;
  dVar2 = (this->m_attachmentExtent).height;
  dVar3 = (this->m_attachmentExtent).depth;
  data_06 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      (&this->m_expectedData,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_450,&local_458,dVar10,dVar2,dVar3,data_06);
  local_468 = makeClearValue(this->m_colorFormat);
  clearPixelBuffer((PixelBufferAccess *)local_450,&local_468);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_380);
  return;
}

Assistant:

Implementation (OperationContext& context, Resource& resource, const DrawCall drawCall)
		: m_context		(context)
		, m_resource	(resource)
		, m_drawCall	(drawCall)
		, m_vertices	(context)
	{
		const DeviceInterface&		vk				= context.getDeviceInterface();
		const VkDevice				device			= context.getDevice();
		Allocator&					allocator		= context.getAllocator();

		// Indirect buffer

		if (m_drawCall == DRAW_CALL_DRAW_INDIRECT)
		{
			m_indirectBuffer = de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
				makeBufferCreateInfo(sizeof(VkDrawIndirectCommand), VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT), MemoryRequirement::HostVisible));

			const Allocation&				alloc				= m_indirectBuffer->getAllocation();
			VkDrawIndirectCommand* const	pIndirectCommand	= static_cast<VkDrawIndirectCommand*>(alloc.getHostPtr());

			pIndirectCommand->vertexCount	= m_vertices.getNumVertices();
			pIndirectCommand->instanceCount	= 1u;
			pIndirectCommand->firstVertex	= 0u;
			pIndirectCommand->firstInstance	= 0u;

			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(VkDrawIndirectCommand));
		}
		else if (m_drawCall == DRAW_CALL_DRAW_INDEXED_INDIRECT)
		{
			m_indirectBuffer = de::MovePtr<Buffer>(new Buffer(vk, device, allocator,
				makeBufferCreateInfo(sizeof(VkDrawIndexedIndirectCommand), VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT), MemoryRequirement::HostVisible));

			const Allocation&					alloc				= m_indirectBuffer->getAllocation();
			VkDrawIndexedIndirectCommand* const	pIndirectCommand	= static_cast<VkDrawIndexedIndirectCommand*>(alloc.getHostPtr());

			pIndirectCommand->indexCount	= m_vertices.getNumIndices();
			pIndirectCommand->instanceCount	= 1u;
			pIndirectCommand->firstIndex	= 0u;
			pIndirectCommand->vertexOffset	= 0u;
			pIndirectCommand->firstInstance	= 0u;

			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(VkDrawIndexedIndirectCommand));
		}

		// Resource image is the color attachment

		m_colorFormat			= m_resource.getImage().format;
		m_colorSubresourceRange	= m_resource.getImage().subresourceRange;
		m_colorImage			= m_resource.getImage().handle;
		m_attachmentExtent		= m_resource.getImage().extent;

		// Pipeline

		m_colorAttachmentView	= makeImageView						  (vk, device, m_colorImage, VK_IMAGE_VIEW_TYPE_2D, m_colorFormat, m_colorSubresourceRange);
		m_renderPass			= makeRenderPass					  (vk, device, m_colorFormat);
		m_framebuffer			= makeFramebuffer					  (vk, device, *m_renderPass, *m_colorAttachmentView, m_attachmentExtent.width, m_attachmentExtent.height, 1u);
		m_pipelineLayout		= makePipelineLayoutWithoutDescriptors(vk, device);

		GraphicsPipelineBuilder pipelineBuilder;
		pipelineBuilder
			.setRenderSize					(tcu::IVec2(m_attachmentExtent.width, m_attachmentExtent.height))
			.setVertexInputSingleAttribute	(m_vertices.getVertexFormat(), m_vertices.getVertexStride())
			.setShader						(vk, device, VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("draw_vert"), DE_NULL)
			.setShader						(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("draw_frag"), DE_NULL);

		m_pipeline = pipelineBuilder.build(vk, device, *m_pipelineLayout, *m_renderPass, context.getPipelineCacheData());

		// Set expected draw values

		m_expectedData.resize(static_cast<size_t>(getPixelBufferSize(m_resource.getImage().format, m_resource.getImage().extent)));
		tcu::PixelBufferAccess imagePixels(mapVkFormat(m_colorFormat), m_attachmentExtent.width, m_attachmentExtent.height, m_attachmentExtent.depth, &m_expectedData[0]);
		clearPixelBuffer(imagePixels, makeClearValue(m_colorFormat));
	}